

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O1

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genParamList
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,InterfaceSchema interface,
          StructSchema schema,Reader brand,Method method)

{
  Reader type;
  Reader value;
  Reader value_00;
  Reader list;
  undefined8 uVar1;
  StructPointerCount SVar2;
  undefined8 uVar3;
  Schema SVar4;
  WirePointer *pWVar5;
  undefined8 uVar6;
  char *pcVar7;
  ArrayDisposer *pAVar8;
  Branch *pBVar9;
  size_t sVar10;
  bool bVar11;
  int iVar12;
  anon_union_8_2_eba6ea51_for_Type_5 params_1;
  RawBrandedSchema *pRVar13;
  ArrayPtr<const_char> *params;
  SegmentReader *pSVar14;
  StringTree *pSVar15;
  StructReader *__return_storage_ptr___00;
  StringTree *pSVar16;
  uint uVar17;
  ulong uVar18;
  Reader RVar19;
  Type TVar20;
  Type type_00;
  StringPtr delim;
  ArrayBuilder<kj::StringTree> builder;
  Array<kj::StringTree> result;
  StringTree local_458;
  StringTree *local_420;
  ulong local_418;
  Schema local_410;
  StringTree *local_408;
  StringTree *local_400;
  StringTree *local_3f8;
  ArrayDisposer *local_3f0;
  Array<kj::StringTree> local_3e8;
  char *local_3c8;
  undefined1 local_3c0 [40];
  char *local_398;
  ArrayDisposer *pAStack_390;
  ArrayDisposer *local_388;
  Branch *local_380;
  size_t sStack_378;
  ArrayDisposer *local_370;
  StringTree local_368;
  StringTree local_330;
  StringTree local_2f8;
  Maybe<capnp::InterfaceSchema::Method> local_2c0;
  Field local_278;
  ArrayPtr<const_char> local_238;
  Schema local_228;
  ListReader LStack_220;
  RawBrandedSchema *local_1e8;
  uint local_1e0;
  undefined4 local_1dc;
  StructReader local_1d8;
  StringTree local_1a8;
  ListReader local_170;
  StructReader local_140;
  StructReader local_110;
  StructReader local_e0;
  FieldList local_b0;
  Maybe<capnp::InterfaceSchema::Method> local_78;
  
  local_420 = __return_storage_ptr__;
  local_410 = schema.super_Schema.raw;
  Schema::getProto((Reader *)&local_2c0,&local_410);
  pSVar15 = local_420;
  if (((uint)local_2c0.ptr.field_1._24_4_ < 0xc0) ||
     (*(long *)(local_2c0.ptr.field_1._8_8_ + 0x10) == 0)) {
    StructSchema::getFields(&local_b0,(StructSchema *)&local_410);
    LStack_220.nestingLimit = local_b0.list.reader.nestingLimit;
    LStack_220._44_4_ = local_b0.list.reader._44_4_;
    LStack_220.elementCount = local_b0.list.reader.elementCount;
    LStack_220.step = local_b0.list.reader.step;
    LStack_220.structDataSize = local_b0.list.reader.structDataSize;
    LStack_220.structPointerCount = local_b0.list.reader.structPointerCount;
    LStack_220.elementSize = local_b0.list.reader.elementSize;
    LStack_220._39_1_ = local_b0.list.reader._39_1_;
    LStack_220.capTable = local_b0.list.reader.capTable;
    LStack_220.ptr = local_b0.list.reader.ptr;
    local_228 = local_b0.parent.super_Schema.raw;
    LStack_220.segment = local_b0.list.reader.segment;
    uVar18 = 0;
    pSVar16 = (StringTree *)0x0;
    local_408 = (StringTree *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (0x38,0,local_b0.list.reader._24_8_ & 0xffffffff,
                           (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_3f8 = local_408 + (local_b0.list.reader._24_8_ & 0xffffffff);
    local_3f0 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_400 = local_408;
    if (LStack_220.elementCount != 0) {
      pcVar7 = local_398;
      pAVar8 = pAStack_390;
      pBVar9 = local_380;
      sVar10 = sStack_378;
      do {
        sStack_378 = sVar10;
        local_380 = pBVar9;
        pAStack_390 = pAVar8;
        local_398 = pcVar7;
        SVar4.raw = local_228.raw;
        local_418 = uVar18;
        _::ListReader::getStructElement(&local_1d8,&LStack_220,(ElementCount)uVar18);
        uVar6 = local_1d8._40_8_;
        pWVar5 = local_1d8.pointers;
        pRVar13 = (RawBrandedSchema *)local_1d8.capTable;
        pSVar14 = local_1d8.segment;
        local_1e8 = SVar4.raw;
        local_278.index = (uint)local_418;
        local_278.proto._reader.segment = local_1d8.segment;
        local_278.proto._reader.capTable = local_1d8.capTable;
        local_278.proto._reader.data = local_1d8.data;
        local_278.proto._reader.pointers = local_1d8.pointers;
        local_278.proto._reader.dataSize = local_1d8.dataSize;
        local_278.proto._reader.pointerCount = local_1d8.pointerCount;
        local_278.proto._reader._38_2_ = local_1d8._38_2_;
        uVar1 = local_278.proto._reader._32_8_;
        local_278.proto._reader.nestingLimit = local_1d8.nestingLimit;
        local_278.proto._reader._44_4_ = local_1d8._44_4_;
        uVar3 = local_278.proto._reader._40_8_;
        local_278.parent.super_Schema.raw = (Schema)(Schema)SVar4.raw;
        local_278._12_4_ = local_1dc;
        local_278.proto._reader.pointerCount = local_1d8.pointerCount;
        SVar2 = local_278.proto._reader.pointerCount;
        local_278.proto._reader.nestingLimit = local_1d8.nestingLimit;
        iVar12 = local_278.proto._reader.nestingLimit;
        local_2c0.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)local_1d8.capTable;
        local_2c0.ptr.field_1._8_8_ = local_1d8.pointers;
        local_2c0.ptr._0_8_ = local_1d8.segment;
        if (local_278.proto._reader.pointerCount == 0) {
          local_278.proto._reader.nestingLimit = 0x7fffffff;
          local_2c0.ptr.field_1.value.parent.super_Schema.raw =
               (InterfaceSchema)(RawBrandedSchema *)0x0;
          local_2c0.ptr.field_1._8_8_ = (WirePointer *)0x0;
          local_2c0.ptr._0_8_ = (SegmentReader *)0x0;
        }
        local_2c0.ptr.field_1._16_4_ = local_278.proto._reader.nestingLimit;
        local_278.proto._reader._32_8_ = uVar1;
        local_278.proto._reader._40_8_ = uVar3;
        local_1e0 = local_278.index;
        RVar19 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_2c0,(void *)0x0,0);
        local_3c8 = RVar19.super_StringPtr.content.ptr;
        if (SVar2 < 3) {
          local_2c0.ptr.field_1._16_4_ = 0x7fffffff;
          local_2c0.ptr.field_1.value.parent.super_Schema.raw =
               (InterfaceSchema)(RawBrandedSchema *)0x0;
          local_2c0.ptr.field_1._8_8_ = (WirePointer *)0x0;
          local_2c0.ptr._0_8_ = (SegmentReader *)0x0;
        }
        else {
          local_2c0.ptr.field_1._8_8_ = pWVar5 + 2;
          local_2c0.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)pRVar13;
          local_2c0.ptr._0_8_ = pSVar14;
          local_2c0.ptr.field_1._16_4_ = iVar12;
        }
        _::PointerReader::getStruct(&local_e0,(PointerReader *)&local_2c0,(word *)0x0);
        local_2c0.ptr._0_8_ = local_2c0.ptr._0_8_ & 0xffffffffffffff00;
        type._reader.capTable = local_e0.capTable;
        type._reader.segment = local_e0.segment;
        type._reader.data = local_e0.data;
        type._reader.pointers = local_e0.pointers;
        type._reader.dataSize = local_e0.dataSize;
        type._reader.pointerCount = local_e0.pointerCount;
        type._reader._38_2_ = local_e0._38_2_;
        type._reader.nestingLimit = local_e0.nestingLimit;
        type._reader._44_4_ = local_e0._44_4_;
        genType(&local_2f8,this,type,interface.super_Schema.raw,&local_2c0);
        if (SVar2 < 4) {
          local_458.text.content.disposer._0_4_ = 0x7fffffff;
          local_458.text.content.ptr = (char *)0x0;
          local_458.text.content.size_ = 0;
          local_458.size_ = 0;
        }
        else {
          local_458.text.content.size_ = (size_t)(pWVar5 + 3);
          local_458.text.content.ptr = (char *)pRVar13;
          local_458.size_ = (size_t)pSVar14;
          local_458.text.content.disposer._0_4_ = iVar12;
        }
        __return_storage_ptr___00 = &local_110;
        _::PointerReader::getStruct
                  (__return_storage_ptr___00,(PointerReader *)&local_458,(word *)0x0);
        value._reader.capTable = local_110.capTable;
        value._reader.segment = local_110.segment;
        value._reader.data = local_110.data;
        value._reader.pointers = local_110.pointers;
        value._reader.dataSize = local_110.dataSize;
        value._reader.pointerCount = local_110.pointerCount;
        value._reader._38_2_ = local_110._38_2_;
        value._reader.nestingLimit = local_110.nestingLimit;
        value._reader._44_4_ = local_110._44_4_;
        bVar11 = isEmptyValue((CapnpcCapnpMain *)__return_storage_ptr___00,value);
        if (bVar11) {
          local_458.size_ = 0x1a7eaf;
          local_458.text.content.ptr = (char *)0x0;
          kj::StringTree::concat<kj::ArrayPtr<char_const>>(&local_368,&local_458,params);
        }
        else {
          TVar20 = StructSchema::Field::getType(&local_278);
          type_00._0_8_ = TVar20.field_4;
          if (SVar2 < 4) {
            params_1.scopeId = 0x7fffffff;
            local_458.text.content.ptr = (char *)0x0;
            local_458.text.content.size_ = 0;
            local_458.size_ = 0;
          }
          else {
            local_458.text.content.size_ = (size_t)(pWVar5 + 3);
            params_1.scopeId = uVar6 & 0xffffffff;
            local_458.text.content.ptr = (char *)pRVar13;
            local_458.size_ = (size_t)pSVar14;
          }
          local_458.text.content.disposer._0_4_ = (int)params_1.scopeId;
          _::PointerReader::getStruct(&local_140,(PointerReader *)&local_458,(word *)0x0);
          value_00._reader.capTable = local_140.capTable;
          value_00._reader.segment = local_140.segment;
          value_00._reader.data = local_140.data;
          value_00._reader.pointers = local_140.pointers;
          value_00._reader.dataSize = local_140.dataSize;
          value_00._reader.pointerCount = local_140.pointerCount;
          value_00._reader._38_2_ = local_140._38_2_;
          value_00._reader.nestingLimit = local_140.nestingLimit;
          value_00._reader._44_4_ = local_140._44_4_;
          type_00.field_4.schema = params_1.schema;
          genValue(&local_330,TVar20._0_8_,type_00,value_00);
          local_458.size_ = 0x197937;
          local_458.text.content.ptr = (char *)0x3;
          kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
                    (&local_368,&local_458,(ArrayPtr<const_char> *)&local_330,
                     (StringTree *)params_1.schema);
        }
        if (SVar2 < 2) {
          iVar12 = 0x7fffffff;
          pRVar13 = (RawBrandedSchema *)0x0;
          local_3c0._16_8_ = (WirePointer *)0x0;
          pSVar14 = (SegmentReader *)0x0;
        }
        else {
          local_3c0._16_8_ = pWVar5 + 1;
        }
        local_3c0._0_8_ = pSVar14;
        local_3c0._8_8_ = pRVar13;
        local_3c0._24_4_ = iVar12;
        _::PointerReader::getList
                  (&local_170,(PointerReader *)local_3c0,INLINE_COMPOSITE,(word *)0x0);
        list.reader.capTable = local_170.capTable;
        list.reader.segment = local_170.segment;
        list.reader.ptr = local_170.ptr;
        list.reader.elementCount = local_170.elementCount;
        list.reader.step = local_170.step;
        list.reader.structDataSize = local_170.structDataSize;
        list.reader.structPointerCount = local_170.structPointerCount;
        list.reader.elementSize = local_170.elementSize;
        list.reader._39_1_ = local_170._39_1_;
        list.reader.nestingLimit = local_170.nestingLimit;
        list.reader._44_4_ = local_170._44_4_;
        pSVar15 = (StringTree *)local_170.segment;
        genAnnotations(&local_458,this,list,interface.super_Schema.raw);
        local_3c0._8_8_ = RVar19.super_StringPtr.content.size_ - 1;
        local_3c0._0_8_ = local_3c8;
        local_238.ptr = " :";
        local_238.size_ = 2;
        pSVar16 = &local_368;
        kj::StringTree::
        concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree>
                  ((StringTree *)(local_3c0 + 0x20),(StringTree *)local_3c0,&local_238,
                   (ArrayPtr<const_char> *)&local_2f8,pSVar16,&local_458,pSVar15);
        uVar18 = local_418;
        pSVar15 = (StringTree *)local_458.branches.size_;
        pBVar9 = local_458.branches.ptr;
        if (local_458.branches.ptr != (Branch *)0x0) {
          local_458.branches.ptr = (Branch *)0x0;
          local_458.branches.size_ = 0;
          (*(code *)**(undefined8 **)local_458.branches.disposer)
                    (local_458.branches.disposer,pBVar9,0x40,pSVar15,pSVar15,
                     kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
          pSVar16 = pSVar15;
        }
        pSVar15 = (StringTree *)local_458.text.content.size_;
        pcVar7 = local_458.text.content.ptr;
        if (local_458.text.content.ptr != (char *)0x0) {
          local_458.text.content.ptr = (char *)0x0;
          local_458.text.content.size_ = 0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_458.text.content.disposer._4_4_,
                               (int)local_458.text.content.disposer))
                    ((undefined8 *)
                     CONCAT44(local_458.text.content.disposer._4_4_,
                              (int)local_458.text.content.disposer),pcVar7,1,pSVar15,pSVar15,0);
          pSVar16 = pSVar15;
        }
        pSVar15 = (StringTree *)local_368.branches.size_;
        pBVar9 = local_368.branches.ptr;
        if (local_368.branches.ptr != (Branch *)0x0) {
          local_368.branches.ptr = (Branch *)0x0;
          local_368.branches.size_ = 0;
          (*(code *)**(undefined8 **)local_368.branches.disposer)
                    (local_368.branches.disposer,pBVar9,0x40,pSVar15,pSVar15,
                     kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
          pSVar16 = pSVar15;
        }
        pSVar15 = (StringTree *)local_368.text.content.size_;
        pcVar7 = local_368.text.content.ptr;
        if (local_368.text.content.ptr != (char *)0x0) {
          local_368.text.content.ptr = (char *)0x0;
          local_368.text.content.size_ = 0;
          (*(code *)**(undefined8 **)local_368.text.content.disposer)
                    (local_368.text.content.disposer,pcVar7,1,pSVar15,pSVar15,0);
          pSVar16 = pSVar15;
        }
        pSVar15 = (StringTree *)local_330.branches.size_;
        pBVar9 = local_330.branches.ptr;
        if (!bVar11) {
          if (local_330.branches.ptr != (Branch *)0x0) {
            local_330.branches.ptr = (Branch *)0x0;
            local_330.branches.size_ = 0;
            (*(code *)**(undefined8 **)local_330.branches.disposer)
                      (local_330.branches.disposer,pBVar9,0x40,pSVar15,pSVar15,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
            pSVar16 = pSVar15;
          }
          pSVar15 = (StringTree *)local_330.text.content.size_;
          pcVar7 = local_330.text.content.ptr;
          if (local_330.text.content.ptr != (char *)0x0) {
            local_330.text.content.ptr = (char *)0x0;
            local_330.text.content.size_ = 0;
            (*(code *)**(undefined8 **)local_330.text.content.disposer)
                      (local_330.text.content.disposer,pcVar7,1,pSVar15,pSVar15,0);
            pSVar16 = pSVar15;
          }
        }
        pSVar15 = (StringTree *)local_2f8.branches.size_;
        pBVar9 = local_2f8.branches.ptr;
        if (local_2f8.branches.ptr != (Branch *)0x0) {
          local_2f8.branches.ptr = (Branch *)0x0;
          local_2f8.branches.size_ = 0;
          (*(code *)**(undefined8 **)local_2f8.branches.disposer)
                    (local_2f8.branches.disposer,pBVar9,0x40,pSVar15,pSVar15,
                     kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
          pSVar16 = pSVar15;
        }
        pSVar15 = (StringTree *)local_2f8.text.content.size_;
        pcVar7 = local_2f8.text.content.ptr;
        if (local_2f8.text.content.ptr != (char *)0x0) {
          local_2f8.text.content.ptr = (char *)0x0;
          local_2f8.text.content.size_ = 0;
          (*(code *)**(undefined8 **)local_2f8.text.content.disposer)
                    (local_2f8.text.content.disposer,pcVar7,1,pSVar15,pSVar15,0);
          pSVar16 = pSVar15;
        }
        local_400->size_ = local_3c0._32_8_;
        (local_400->text).content.ptr = local_398;
        (local_400->text).content.size_ = (size_t)pAStack_390;
        (local_400->text).content.disposer = local_388;
        local_398 = (char *)0x0;
        pcVar7 = local_398;
        pAStack_390 = (ArrayDisposer *)0x0;
        pAVar8 = pAStack_390;
        (local_400->branches).ptr = local_380;
        (local_400->branches).size_ = sStack_378;
        (local_400->branches).disposer = local_370;
        local_380 = (Branch *)0x0;
        pBVar9 = local_380;
        sStack_378 = 0;
        sVar10 = sStack_378;
        local_400 = local_400 + 1;
        sStack_378 = 0;
        local_380 = (Branch *)0x0;
        pAStack_390 = (ArrayDisposer *)0x0;
        local_398 = (char *)0x0;
        uVar17 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar17;
      } while (uVar17 != LStack_220.elementCount);
    }
    local_3e8.size_ = ((long)local_400 - (long)local_408 >> 3) * 0x6db6db6db6db6db7;
    local_3e8.ptr = local_408;
    local_3e8.disposer = local_3f0;
    delim.content.size_ = 3;
    delim.content.ptr = ", ";
    kj::StringTree::StringTree(&local_1a8,&local_3e8,delim);
    pSVar15 = local_420;
    kj::strTree<char_const(&)[2],kj::StringTree,char_const(&)[2]>
              (local_420,(kj *)0x1978ac,(char (*) [2])&local_1a8,(StringTree *)0x1a39c7,
               (char (*) [2])pSVar16);
    sVar10 = local_1a8.branches.size_;
    pBVar9 = local_1a8.branches.ptr;
    if (local_1a8.branches.ptr != (Branch *)0x0) {
      local_1a8.branches.ptr = (Branch *)0x0;
      local_1a8.branches.size_ = 0;
      (*(code *)**(undefined8 **)local_1a8.branches.disposer)
                (local_1a8.branches.disposer,pBVar9,0x40,sVar10,sVar10,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar10 = local_1a8.text.content.size_;
    pcVar7 = local_1a8.text.content.ptr;
    if (local_1a8.text.content.ptr != (char *)0x0) {
      local_1a8.text.content.ptr = (char *)0x0;
      local_1a8.text.content.size_ = 0;
      (*(code *)**(undefined8 **)local_1a8.text.content.disposer)
                (local_1a8.text.content.disposer,pcVar7,1,sVar10,sVar10,0);
    }
    sVar10 = local_3e8.size_;
    pSVar16 = local_3e8.ptr;
    if (local_3e8.ptr != (StringTree *)0x0) {
      local_3e8.ptr = (StringTree *)0x0;
      local_3e8.size_ = 0;
      (*(code *)**(undefined8 **)local_3e8.disposer)
                (local_3e8.disposer,pSVar16,0x38,sVar10,sVar10,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
  }
  else {
    local_78.ptr.isSet = true;
    local_78.ptr.field_1.value.parent.super_Schema.raw =
         (InterfaceSchema)(InterfaceSchema)method.parent.super_Schema.raw;
    local_78.ptr.field_1._8_8_ = method._8_8_;
    local_78.ptr.field_1.value.proto._reader.segment = method.proto._reader.segment;
    local_78.ptr.field_1.value.proto._reader.capTable = method.proto._reader.capTable;
    local_78.ptr.field_1.value.proto._reader.data = method.proto._reader.data;
    local_78.ptr.field_1.value.proto._reader.pointers = method.proto._reader.pointers;
    local_78.ptr.field_1.value.proto._reader.dataSize = method.proto._reader.dataSize;
    local_78.ptr.field_1.value.proto._reader.pointerCount = method.proto._reader.pointerCount;
    local_78.ptr.field_1._54_2_ = method.proto._reader._38_2_;
    local_78.ptr.field_1._56_8_ = method.proto._reader._40_8_;
    nodeName(local_420,this,local_410,interface.super_Schema.raw,brand,&local_78);
  }
  return pSVar15;
}

Assistant:

kj::StringTree genParamList(InterfaceSchema interface, StructSchema schema,
                              schema::Brand::Reader brand, InterfaceSchema::Method method) {
    if (schema.getProto().getScopeId() == 0) {
      // A named parameter list.
      return kj::strTree("(", kj::StringTree(
          KJ_MAP(field, schema.getFields()) {
            auto proto = field.getProto();
            auto slot = proto.getSlot();

            return kj::strTree(
                proto.getName(), " :", genType(slot.getType(), interface, nullptr),
                isEmptyValue(slot.getDefaultValue()) ? kj::strTree("") :
                    kj::strTree(" = ", genValue(field.getType(), slot.getDefaultValue())),
                genAnnotations(proto.getAnnotations(), interface));
          }, ", "), ")");
    } else {
      return nodeName(schema, interface, brand, method);
    }
  }